

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

void lj_str_resize(lua_State *L,MSize newmask)

{
  undefined8 *puVar1;
  long lVar2;
  GCobj *pGVar3;
  uint uVar4;
  StrHash SVar5;
  void *__s;
  uint local_98;
  ulong uStack_90;
  MSize shash;
  uintptr_t u;
  MSize hash_1;
  GCstr *s_1;
  GCobj *next;
  GCobj *o_1;
  int secondary;
  MSize hash;
  GCstr *s;
  GCobj *o;
  int newsecond;
  MSize i;
  GCRef *oldtab;
  GCRef *newtab;
  global_State *g;
  MSize newmask_local;
  lua_State *L_local;
  
  puVar1 = (undefined8 *)(L->glref).ptr64;
  lVar2 = puVar1[0x13];
  if ((*(char *)((long)puVar1 + 0x21) != '\x03') && (newmask < 0x3ffffff)) {
    __s = lj_mem_realloc(L,(void *)0x0,0,(ulong)(newmask + 1) << 3);
    memset(__s,0,(ulong)(newmask + 1) << 3);
    if (*(char *)((long)puVar1 + 0xad) != '\0') {
      o._0_4_ = 0;
      for (o._4_4_ = *(uint *)(puVar1 + 0x14); uVar4 = newmask, o._4_4_ != 0xffffffff;
          o._4_4_ = o._4_4_ - 1) {
        for (s = (GCstr *)(*(ulong *)(lVar2 + (ulong)o._4_4_ * 8) & 0xfffffffffffffffe);
            s != (GCstr *)0x0; s = (GCstr *)(s->nextgc).gcptr64) {
          if (s->hashalg == '\0') {
            local_98 = s->hash;
          }
          else {
            local_98 = hash_sparse(puVar1[0x16],(char *)(s + 1),s->len);
          }
          *(long *)((long)__s + (ulong)(newmask & local_98) * 8) =
               *(long *)((long)__s + (ulong)(newmask & local_98) * 8) + 1;
        }
      }
      while (o._4_4_ = uVar4, o._4_4_ != 0xffffffff) {
        uVar4 = (uint)(0x20 < *(ulong *)((long)__s + (ulong)o._4_4_ * 8));
        o._0_4_ = uVar4 | (uint)o;
        *(long *)((long)__s + (ulong)o._4_4_ * 8) = (long)(int)uVar4;
        uVar4 = o._4_4_ - 1;
      }
      *(char *)((long)puVar1 + 0xad) = (char)(uint)o;
    }
    for (o._4_4_ = *(uint *)(puVar1 + 0x14); o._4_4_ != 0xffffffff; o._4_4_ = o._4_4_ - 1) {
      next = (GCobj *)(*(ulong *)(lVar2 + (ulong)o._4_4_ * 8) & 0xfffffffffffffffe);
      while (next != (GCobj *)0x0) {
        pGVar3 = (GCobj *)(next->gch).nextgc.gcptr64;
        uVar4 = (next->str).hash;
        if ((next->gch).unused2 == '\0') {
          u._4_4_ = newmask & uVar4;
          uStack_90 = *(ulong *)((long)__s + (ulong)u._4_4_ * 8);
          if ((uStack_90 & 1) != 0) {
            SVar5 = hash_dense(puVar1[0x16],(next->str).hash,(char *)&(next->ud).len,(next->str).len
                              );
            (next->str).hash = SVar5;
            (next->gch).unused2 = '\x01';
            u._4_4_ = newmask & SVar5;
            uStack_90 = *(ulong *)((long)__s + (ulong)u._4_4_ * 8);
          }
        }
        else {
          SVar5 = hash_sparse(puVar1[0x16],(char *)&(next->ud).len,(next->str).len);
          uStack_90 = *(ulong *)((long)__s + (ulong)(SVar5 & newmask) * 8);
          if ((uStack_90 & 1) == 0) {
            (next->str).hash = SVar5;
            (next->gch).unused2 = '\0';
            u._4_4_ = SVar5 & newmask;
          }
          else {
            u._4_4_ = newmask & uVar4;
            uStack_90 = *(ulong *)((long)__s + (ulong)u._4_4_ * 8);
          }
        }
        (next->gch).nextgc.gcptr64 = uStack_90 & 0xfffffffffffffffe;
        *(ulong *)((long)__s + (ulong)u._4_4_ * 8) = (ulong)next | uStack_90 & 1;
        next = pGVar3;
      }
    }
    puVar1[2] = puVar1[2] + (ulong)(*(int *)(puVar1 + 0x14) + 1) * -8;
    (*(code *)*puVar1)(puVar1[1],puVar1[0x13],(ulong)(*(int *)(puVar1 + 0x14) + 1) * 8,0);
    puVar1[0x13] = __s;
    *(MSize *)(puVar1 + 0x14) = newmask;
  }
  return;
}

Assistant:

void lj_str_resize(lua_State *L, MSize newmask)
{
  global_State *g = G(L);
  GCRef *newtab, *oldtab = g->str.tab;
  MSize i;

  /* No resizing during GC traversal or if already too big. */
  if (g->gc.state == GCSsweepstring || newmask >= LJ_MAX_STRTAB-1)
    return;

  newtab = lj_mem_newvec(L, newmask+1, GCRef);
  memset(newtab, 0, (newmask+1)*sizeof(GCRef));

#if LUAJIT_SECURITY_STRHASH
  /* Check which chains need secondary hashes. */
  if (g->str.second) {
    int newsecond = 0;
    /* Compute primary chain lengths. */
    for (i = g->str.mask; i != ~(MSize)0; i--) {
      GCobj *o = (GCobj *)(gcrefu(oldtab[i]) & ~(uintptr_t)1);
      while (o) {
	GCstr *s = gco2str(o);
	MSize hash = s->hashalg ? hash_sparse(g->str.seed, strdata(s), s->len) :
				  s->hash;
	hash &= newmask;
	setgcrefp(newtab[hash], gcrefu(newtab[hash]) + 1);
	o = gcnext(o);
      }
    }
    /* Mark secondary chains. */
    for (i = newmask; i != ~(MSize)0; i--) {
      int secondary = gcrefu(newtab[i]) > LJ_STR_MAXCOLL;
      newsecond |= secondary;
      setgcrefp(newtab[i], secondary);
    }
    g->str.second = newsecond;
  }
#endif

  /* Reinsert all strings from the old table into the new table. */
  for (i = g->str.mask; i != ~(MSize)0; i--) {
    GCobj *o = (GCobj *)(gcrefu(oldtab[i]) & ~(uintptr_t)1);
    while (o) {
      GCobj *next = gcnext(o);
      GCstr *s = gco2str(o);
      MSize hash = s->hash;
#if LUAJIT_SECURITY_STRHASH
      uintptr_t u;
      if (LJ_LIKELY(!s->hashalg)) {  /* String hashed with primary hash. */
	hash &= newmask;
	u = gcrefu(newtab[hash]);
	if (LJ_UNLIKELY(u & 1)) {  /* Switch string to secondary hash. */
	  s->hash = hash = hash_dense(g->str.seed, s->hash, strdata(s), s->len);
	  s->hashalg = 1;
	  hash &= newmask;
	  u = gcrefu(newtab[hash]);
	}
      } else {  /* String hashed with secondary hash. */
	MSize shash = hash_sparse(g->str.seed, strdata(s), s->len);
	u = gcrefu(newtab[shash & newmask]);
	if (u & 1) {
	  hash &= newmask;
	  u = gcrefu(newtab[hash]);
	} else {  /* Revert string back to primary hash. */
	  s->hash = shash;
	  s->hashalg = 0;
	  hash = (shash & newmask);
	}
      }
      /* NOBARRIER: The string table is a GC root. */
      setgcrefp(o->gch.nextgc, (u & ~(uintptr_t)1));
      setgcrefp(newtab[hash], ((uintptr_t)o | (u & 1)));
#else
      hash &= newmask;
      /* NOBARRIER: The string table is a GC root. */
      setgcrefr(o->gch.nextgc, newtab[hash]);
      setgcref(newtab[hash], o);
#endif
      o = next;
    }
  }

  /* Free old table and replace with new table. */
  lj_str_freetab(g);
  g->str.tab = newtab;
  g->str.mask = newmask;
}